

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  MemTable *this_00;
  MemTable *this_01;
  bool bVar1;
  bool bVar2;
  Version *this_02;
  GetStats *in_R8;
  undefined1 local_170 [8];
  undefined1 local_168 [8];
  LookupKey lkey;
  GetStats stats;
  bool have_stat_update;
  Version *current;
  MemTable *imm;
  MemTable *mem;
  SequenceNumber snapshot;
  MutexLock local_40;
  MutexLock l;
  string *value_local;
  Slice *key_local;
  ReadOptions *options_local;
  DBImpl *this_local;
  Status *s;
  
  l.mu_._7_1_ = 0;
  Status::Status((Status *)this);
  MutexLock::MutexLock(&local_40,(Mutex *)(options + 0xc));
  if (key->size_ == 0) {
    mem = (MemTable *)VersionSet::LastSequence(*(VersionSet **)(options + 0x22));
  }
  else {
    mem = *(MemTable **)(key->size_ + 8);
  }
  this_00 = (MemTable *)options[0x12].snapshot;
  this_01 = *(MemTable **)(options + 0x13);
  this_02 = VersionSet::current(*(VersionSet **)(options + 0x22));
  MemTable::Ref(this_00);
  if (this_01 != (MemTable *)0x0) {
    MemTable::Ref(this_01);
  }
  Version::Ref(this_02);
  bVar2 = false;
  port::Mutex::Unlock((Mutex *)(options + 0xc));
  LookupKey::LookupKey((LookupKey *)local_168,(Slice *)value,(SequenceNumber)mem);
  bVar1 = MemTable::Get(this_00,(LookupKey *)local_168,(string *)in_R8,(Status *)this);
  if ((!bVar1) &&
     ((this_01 == (MemTable *)0x0 ||
      (bVar1 = MemTable::Get(this_01,(LookupKey *)local_168,(string *)in_R8,(Status *)this), !bVar1)
      ))) {
    Version::Get((Version *)local_170,(ReadOptions *)this_02,(LookupKey *)key,(string *)local_168,
                 in_R8);
    Status::operator=((Status *)this,(Status *)local_170);
    Status::~Status((Status *)local_170);
    bVar2 = true;
  }
  port::Mutex::Lock((Mutex *)(options + 0xc));
  LookupKey::~LookupKey((LookupKey *)local_168);
  if ((bVar2) && (bVar2 = Version::UpdateStats(this_02,(GetStats *)(lkey.space_ + 0xc0)), bVar2)) {
    MaybeScheduleCompaction((DBImpl *)options);
  }
  MemTable::Unref(this_00);
  if (this_01 != (MemTable *)0x0) {
    MemTable::Unref(this_01);
  }
  Version::Unref(this_02);
  l.mu_._7_1_ = 1;
  MutexLock::~MutexLock(&local_40);
  if ((l.mu_._7_1_ & 1) == 0) {
    Status::~Status((Status *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Get(const ReadOptions &options,
                   const Slice &key,
                   std::string *value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot!=NULL) {
    snapshot = reinterpret_cast<const SnapshotImpl *>(options.snapshot)->number_;
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable *mem = mem_;
  MemTable *imm = imm_;
  Version *current = versions_->current();
  mem->Ref();
  if (imm!=NULL) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm!=NULL && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm!=NULL) imm->Unref();
  current->Unref();
  return s;
}